

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
baseObject::drawParametricEquation
          (baseObject *this,_func_point_double *func,range *_rangeT,int cDivSteps)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  _point local_d8;
  _point local_c8;
  double local_b8;
  double xStep;
  double slope;
  point diff [2];
  point pt;
  double t;
  size_t i;
  double dStep;
  bezierPoint dPoint;
  double cStep;
  int cDivSteps_local;
  range *_rangeT_local;
  _func_point_double *func_local;
  baseObject *this_local;
  
  dVar2 = _range::getSpan(_rangeT);
  dPoint.pt[2].y = dVar2 / (double)cDivSteps;
  bezierPoint::bezierPoint((bezierPoint *)&dStep);
  dVar2 = dPoint.pt[2].y / 3.0;
  for (t = 0.0; (ulong)t <= (ulong)(long)cDivSteps; t = (double)((long)t + 1)) {
    dVar5 = _rangeT->min;
    auVar4._8_4_ = (int)((ulong)t >> 0x20);
    auVar4._0_8_ = t;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(t,0)) - 4503599627370496.0)) * dPoint.pt[2].y + dVar5
    ;
    diff[1].y = (double)(*func)(dVar3);
    std::vector<_point,_std::allocator<_point>_>::push_back(&this->points,(value_type *)&diff[1].y);
    if ((this->rangeX).min <= diff[1].y) {
      local_e8 = (this->rangeX).min;
    }
    else {
      local_e8 = diff[1].y;
    }
    (this->rangeX).min = local_e8;
    pdVar1 = &(this->rangeX).max;
    if (diff[1].y < *pdVar1 || diff[1].y == *pdVar1) {
      local_f0 = (this->rangeX).max;
    }
    else {
      local_f0 = diff[1].y;
    }
    (this->rangeX).max = local_f0;
    local_f8 = dVar5;
    if ((this->rangeY).min <= dVar5) {
      local_f8 = (this->rangeY).min;
    }
    (this->rangeY).min = local_f8;
    pdVar1 = &(this->rangeY).max;
    local_100 = dVar5;
    if (dVar5 < *pdVar1 || dVar5 == *pdVar1) {
      local_100 = (this->rangeY).max;
    }
    (this->rangeY).max = local_100;
    dVar6 = dVar5;
    slope = (double)(*func)(dVar3 - dVar2);
    diff[0].x = dVar6;
    diff[0].y = (double)(*func)(dVar3 + dVar2);
    xStep = (dVar6 - diff[0].x) / 2.0;
    local_b8 = (diff[0].y - slope) / 2.0;
    diff[1].x = dVar6;
    _point::_point(&local_c8,diff[1].y - local_b8,dVar5 - xStep);
    dPoint.pt[0].y = local_c8.x;
    dPoint.pt[1].x = local_c8.y;
    dPoint.pt[1].y = diff[1].y;
    dPoint.pt[2].x = dVar5;
    if (t != 0.0) {
      std::vector<bezierPoint,_std::allocator<bezierPoint>_>::push_back
                (&this->curves,(value_type *)&dStep);
    }
    _point::_point(&local_d8,diff[1].y + local_b8,dVar5 + xStep);
  }
  return;
}

Assistant:

void drawParametricEquation(point (*func)(double), const range& _rangeT, const int cDivSteps)
    {
        double cStep = _rangeT.getSpan() / cDivSteps;
        //rangeX = _rangeX;

        // for differentials
        bezierPoint dPoint;
        double dStep = cStep / 3.;

        for (size_t i = 0; i <= cDivSteps; i++)
        {
            double t = _rangeT.min + i * cStep;
            point pt = func(t);
            points.push_back(pt);

            // check the range of Y
            rangeX.min = pt.x < rangeX.min ? pt.x : rangeX.min;
            rangeX.max = pt.x > rangeX.max ? pt.x : rangeX.max;
            rangeY.min = pt.y < rangeY.min ? pt.y : rangeY.min;
            rangeY.max = pt.y > rangeY.max ? pt.y : rangeY.max;

            // compute differentials
            point diff[] = { func(t - dStep), func(t + dStep) };
            double slope = (diff[1].y - diff[0].y) / 2.;
            double xStep = (diff[1].x - diff[0].x) / 2.;
            dPoint.pt[1] = point(pt.x - xStep, pt.y - slope);
            dPoint.pt[2] = pt;
            if (i != 0)
            { // skip first iteration
                curves.push_back(dPoint);
            }
            dPoint.pt[0] = point(pt.x + xStep, pt.y + slope);
        }
    }